

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O0

void asn1::dumpDER(MemBuffer *mb,int level,int offset)

{
  bool bVar1;
  byte bVar2;
  unsigned_short uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  MemBuffer local_f0;
  int local_d0;
  uint local_cc;
  int i;
  uint v;
  undefined1 local_98 [8];
  MemBuffer mb2;
  int o;
  pair<int,_int> p;
  uint offs;
  char spaces [70];
  int offset_local;
  int level_local;
  MemBuffer *mb_local;
  
  memcpy(&p.second,"                                                                     ",0x46);
  *(undefined1 *)((long)&p.second + (long)(level << 2)) = 0;
  while (bVar1 = MemBuffer::done(mb), ((bVar1 ^ 0xffU) & 1) != 0) {
    uVar4 = MemBuffer::pos(mb);
    p.first = (int)uVar4 + offset;
    register0x00000000 = MemBuffer::readDERHead(mb);
    uVar4 = MemBuffer::pos(mb);
    mb2.readpos._0_4_ = (int)uVar4;
    MemBuffer::readBuffer((MemBuffer *)local_98,mb,o);
    printf("%04x : %s%02x %04x : ",(ulong)(uint)p.first,&p.second,
           (ulong)stack0xffffffffffffff8c & 0xffffffff,(ulong)stack0xffffffffffffff8c >> 0x20);
    if ((mb2.readpos._4_4_ == 0x13) || (mb2.readpos._4_4_ == 0x17)) {
      MemBuffer::readString_abi_cxx11_((string *)&i,(MemBuffer *)local_98,o);
      uVar5 = std::__cxx11::string::c_str();
      printf("\"%s\" \n",uVar5);
      std::__cxx11::string::~string((string *)&i);
    }
    else if (mb2.readpos._4_4_ == 2) {
      local_cc = 0;
      if (o == 1) {
        bVar2 = MemBuffer::read<unsigned_char>((MemBuffer *)local_98);
        local_cc = (uint)bVar2;
      }
      else if (o == 2) {
        uVar3 = MemBuffer::read<unsigned_short>((MemBuffer *)local_98);
        local_cc = (uint)uVar3;
      }
      else if (o == 4) {
        local_cc = MemBuffer::read<unsigned_int>((MemBuffer *)local_98);
      }
      printf("%x\n",(ulong)local_cc);
    }
    else if (((mb2.readpos._4_4_ == 3) || (mb2.readpos._4_4_ == 4)) || (mb2.readpos._4_4_ == 6)) {
      for (local_d0 = 0; local_d0 < o; local_d0 = local_d0 + 1) {
        bVar2 = MemBuffer::read<unsigned_char>((MemBuffer *)local_98);
        printf("%02x ",(ulong)bVar2);
      }
      printf("\n");
    }
    else if (mb2.readpos._4_4_ < 0x30) {
      if (mb2.readpos._4_4_ == 5) {
        printf("NULL\n");
      }
      else {
        printf("<data>\n");
      }
    }
    else {
      printf("\n");
      MemBuffer::MemBuffer(&local_f0,(MemBuffer *)local_98);
      dumpDER(&local_f0,level + 1,(int)mb2.readpos);
      MemBuffer::~MemBuffer(&local_f0);
    }
    MemBuffer::~MemBuffer((MemBuffer *)local_98);
  }
  return;
}

Assistant:

void dumpDER(MemBuffer mb, int level, int offset)
{
    char spaces[] =
        "                                                                     ";
    spaces[level * 4] = 0;
    while (!mb.done()) {
        unsigned int offs = mb.pos() + offset;
        auto p = mb.readDERHead();
        int o = mb.pos();
        MemBuffer mb2 = mb.readBuffer(p.second);
        printf("%04x : %s%02x %04x : ", offs, spaces, p.first, p.second);

        if (p.first == 0x13 || p.first == 0x17) {
            printf("\"%s\" \n", mb2.readString(p.second).c_str());
        } else if (p.first == 0x02) {
            unsigned v = 0;
            switch (p.second) {
            case 1:
                v = mb2.read<uint8_t>();
                break;
            case 2:
                v = mb2.read<uint16_t>();
                break;
            case 4:
                v = mb2.read<uint32_t>();
                break;
            }
            printf("%x\n", v);
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
            for (int i = 0; i < p.second; i++)
                printf("%02x ", mb2.read<uint8_t>());
            printf("\n");
        } else if (p.first >= 0x30) {
            printf("\n");
            dumpDER(mb2, level + 1, o);
        } else if (p.first == 5)
            printf("NULL\n");
        else
            printf("<data>\n");
    }
}